

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O0

uint I_MakeRNGSeed(void)

{
  time_t tVar1;
  int local_10;
  uint local_c;
  int file;
  uint seed;
  
  tVar1 = time((time_t *)0x0);
  local_c = (uint)tVar1;
  local_10 = open("/dev/urandom",0);
  if (local_10 < 0) {
    local_10 = open("/dev/random",0);
  }
  if (-1 < local_10) {
    read(local_10,&local_c,4);
    close(local_10);
  }
  return local_c;
}

Assistant:

unsigned int I_MakeRNGSeed()
{
	unsigned int seed;
	int file;

	// Try reading from /dev/urandom first, then /dev/random, then
	// if all else fails, use a crappy seed from time().
	seed = time(NULL);
	file = open("/dev/urandom", O_RDONLY);
	if (file < 0)
	{
		file = open("/dev/random", O_RDONLY);
	}
	if (file >= 0)
	{
		read(file, &seed, sizeof(seed));
		close(file);
	}
	return seed;
}